

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::SetTranslation(AActor *this,FName *trname)

{
  DWORD DVar1;
  int iVar2;
  undefined4 extraout_var;
  FName local_c;
  PClass *pPVar3;
  
  local_c = (FName)trname->Index;
  if (*FName::NameData.NameArray[local_c.Index].Text == '\0') {
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    DVar1 = *(DWORD *)(pPVar3->Defaults + 0x3c0);
  }
  else {
    DVar1 = R_FindCustomTranslation(&local_c);
    if ((int)DVar1 < 0) {
      return;
    }
  }
  this->Translation = DVar1;
  return;
}

Assistant:

void AActor::SetTranslation(FName trname)
{
	// There is no constant for the empty name...
	if (trname.GetChars()[0] == 0)
	{
		// an empty string resets to the default
		Translation = GetDefault()->Translation;
		return;
	}

	int tnum = R_FindCustomTranslation(trname);
	if (tnum >= 0)
	{
		Translation = tnum;
	}
	// silently ignore if the name does not exist, this would create some insane message spam otherwise.
}